

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

SocketOptions anon_unknown.dwarf_97e7b5::optionsForPlatform(SocketOptions srcOptions)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QLocalServer::SocketOption> in_EDI;
  long in_FS_OFFSET;
  SocketOption in_stack_ffffffffffffffec;
  QFlagsStorage<QLocalServer::SocketOption> in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFlags<QLocalServer::SocketOption>::testFlag
                    ((QFlags<QLocalServer::SocketOption> *)
                     CONCAT44(in_stack_fffffffffffffff4.i,in_EDI.i),in_stack_ffffffffffffffec);
  if (bVar2) {
    QFlags<QLocalServer::SocketOption>::QFlags
              ((QFlags<QLocalServer::SocketOption> *)CONCAT44(in_stack_fffffffffffffff4.i,in_EDI.i),
               in_stack_ffffffffffffffec);
    in_EDI.i = in_stack_fffffffffffffff4.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QLocalServer::SocketOption,_4>)
         (QFlagsStorageHelper<QLocalServer::SocketOption,_4>)in_EDI.i;
}

Assistant:

QLocalServer::SocketOptions optionsForPlatform(QLocalServer::SocketOptions srcOptions)
{
    // For OS that does not support abstract namespace the AbstractNamespaceOption
    // means that we go for WorldAccessOption - as it is the closest option in
    // regards of access rights. In Linux/Android case we clean-up the access rights.

    if (srcOptions.testFlag(QLocalServer::AbstractNamespaceOption)) {
        if (PlatformSupportsAbstractNamespace)
            return QLocalServer::AbstractNamespaceOption;
        else
            return QLocalServer::WorldAccessOption;
    }
    return srcOptions;
}